

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneindex.cpp
# Opt level: O3

void __thiscall
QGraphicsSceneIndex::QGraphicsSceneIndex(QGraphicsSceneIndex *this,QGraphicsScene *scene)

{
  QObjectPrivate *this_00;
  
  this_00 = (QObjectPrivate *)operator_new(0x80);
  QObjectPrivate::QObjectPrivate(this_00,QObjectPrivateVersion);
  *(undefined ***)this_00 = &PTR__QGraphicsSceneIndexPrivate_00814058;
  *(QGraphicsScene **)(this_00 + 0x78) = scene;
  QObject::QObject((QObject *)this,this_00,&scene->super_QObject);
  *(undefined ***)this = &PTR_metaObject_00814088;
  QGraphicsSceneIndexPrivate::init
            (*(QGraphicsSceneIndexPrivate **)(this + 8),(EVP_PKEY_CTX *)this_00);
  return;
}

Assistant:

QGraphicsSceneIndex::QGraphicsSceneIndex(QGraphicsScene *scene)
: QObject(*new QGraphicsSceneIndexPrivate(scene), scene)
{
    d_func()->init();
}